

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_CryptoPro_C_ParamSet.c
# Opt level: O2

void fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_inv(uint64_t *output,uint64_t *t1)

{
  int iVar1;
  bool bVar2;
  fe_t_conflict acc;
  fe_t_conflict t25;
  fe_t_conflict t15;
  fe_t_conflict t11;
  fe_t_conflict t29;
  fe_t_conflict t21;
  fe_t_conflict t7;
  fe_t_conflict t3;
  fe_t_conflict t23;
  fe_t_conflict t13;
  fe_t_conflict t9;
  fe_t_conflict t5;
  fe_t_conflict t31;
  fe_t_conflict t27;
  fe_t_conflict t19;
  fe_t_conflict t17;
  
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,t1);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t3,t1,acc);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t5,t3,acc);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t7,t5,acc);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t9,t7,acc);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t11,t9,acc);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t13,t11,acc);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t15,t13,acc);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t17,t15,acc);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t19,t17,acc);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t21,t19,acc);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t23,t21,acc);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t25,t23,acc);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t27,t25,acc);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t29,t27,acc);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t31,t29,acc);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,t9);
  iVar1 = 4;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t23);
  iVar1 = 5;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t7);
  iVar1 = 5;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t27);
  iVar1 = 7;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t1);
  iVar1 = 5;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t15);
  iVar1 = 5;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t21);
  iVar1 = 5;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t21);
  iVar1 = 8;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t11);
  iVar1 = 7;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t1);
  iVar1 = 6;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t1);
  iVar1 = 5;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t29);
  iVar1 = 5;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t11);
  iVar1 = 7;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t15);
  iVar1 = 6;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t25);
  iVar1 = 5;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t1);
  iVar1 = 5;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t15);
  iVar1 = 6;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t13);
  iVar1 = 5;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t13);
  iVar1 = 6;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t1);
  iVar1 = 5;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t25);
  iVar1 = 8;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t21);
  iVar1 = 5;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t11);
  iVar1 = 7;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t31);
  iVar1 = 5;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t1);
  iVar1 = 5;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t3);
  iVar1 = 6;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t29);
  iVar1 = 6;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t3);
  iVar1 = 6;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t15);
  iVar1 = 7;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t9);
  iVar1 = 8;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t5);
  iVar1 = 6;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t7);
  iVar1 = 6;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t19);
  iVar1 = 5;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t15);
  iVar1 = 7;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t25);
  iVar1 = 5;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t17);
  iVar1 = 5;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t29);
  iVar1 = 5;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t29);
  iVar1 = 5;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t25);
  iVar1 = 7;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t1);
  iVar1 = 7;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t11);
  iVar1 = 6;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t23);
  iVar1 = 5;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc,acc,t11);
  iVar1 = 7;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc,acc);
  }
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(output,acc,t25);
  return;
}

Assistant:

static void fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_inv(fe_t output,
                                                            const fe_t t1) {
    int i;
    /* temporary variables */
    fe_t acc, t11, t13, t15, t17, t19, t21, t23, t25, t27, t29, t3, t31, t5, t7,
        t9;

    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, t1);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t3, t1, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t5, t3, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t7, t5, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t9, t7, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t11, t9, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t13, t11, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t15, t13, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t17, t15, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t19, t17, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t21, t19, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t23, t21, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t25, t23, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t27, t25, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t29, t27, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(t31, t29, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, t9);
    for (i = 0; i < 4; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t23);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t7);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t27);
    for (i = 0; i < 7; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t1);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t15);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t21);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t21);
    for (i = 0; i < 8; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t11);
    for (i = 0; i < 7; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t1);
    for (i = 0; i < 6; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t1);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t29);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t11);
    for (i = 0; i < 7; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t15);
    for (i = 0; i < 6; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t25);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t1);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t15);
    for (i = 0; i < 6; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t13);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t13);
    for (i = 0; i < 6; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t1);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t25);
    for (i = 0; i < 8; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t21);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t11);
    for (i = 0; i < 7; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t31);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t1);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t3);
    for (i = 0; i < 6; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t29);
    for (i = 0; i < 6; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t3);
    for (i = 0; i < 6; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t15);
    for (i = 0; i < 7; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t9);
    for (i = 0; i < 8; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t5);
    for (i = 0; i < 6; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t7);
    for (i = 0; i < 6; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t19);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t15);
    for (i = 0; i < 7; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t25);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t17);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t29);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t29);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t25);
    for (i = 0; i < 7; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t1);
    for (i = 0; i < 7; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t11);
    for (i = 0; i < 6; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t23);
    for (i = 0; i < 5; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(acc, acc, t11);
    for (i = 0; i < 7; i++)
        fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_square(acc, acc);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(output, acc, t25);
}